

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.cxx
# Opt level: O0

void __thiscall Fl_Text_Display::draw(Fl_Text_Display *this)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Fl_Color c;
  Fl_Boxtype t;
  uint uVar6;
  Fl_Text_Buffer *pFVar7;
  Fl_Surface_Device *pFVar8;
  Fl_Surface_Device *pFVar9;
  Fl_Text_Display *pFVar10;
  Fl_Color local_58;
  int local_40;
  int local_3c;
  int Y_1;
  int X_1;
  int has_selection;
  int end;
  int start;
  int H_1;
  int W_1;
  int Y;
  int X;
  int H;
  int W;
  Fl_Color bgcolor;
  Fl_Text_Display *this_local;
  
  _W = this;
  pFVar7 = buffer(this);
  if (pFVar7 == (Fl_Text_Buffer *)0x0) {
    Fl_Widget::draw_box((Fl_Widget *)this);
  }
  else {
    iVar2 = Fl_Widget::x((Fl_Widget *)this);
    iVar3 = Fl_Widget::y((Fl_Widget *)this);
    iVar4 = Fl_Widget::w((Fl_Widget *)this);
    iVar5 = Fl_Widget::h((Fl_Widget *)this);
    fl_push_clip(iVar2,iVar3,iVar4,iVar5);
    iVar2 = Fl_Widget::active_r((Fl_Widget *)this);
    if (iVar2 == 0) {
      c = Fl_Widget::color((Fl_Widget *)this);
      local_58 = fl_inactive(c);
    }
    else {
      local_58 = Fl_Widget::color((Fl_Widget *)this);
    }
    H = local_58;
    bVar1 = Fl_Widget::damage((Fl_Widget *)this);
    if ((bVar1 & 0x80) == 0) {
      bVar1 = Fl_Widget::damage((Fl_Widget *)this);
      if ((bVar1 & 6) != 0) {
        fl_push_clip((this->text_area).x + -3,(this->text_area).y,(this->text_area).w + 6,
                     (this->text_area).h);
        fl_rectf((this->text_area).x + -3,this->mCursorOldY,3,this->mMaxsize,H);
        fl_rectf((this->text_area).x + (this->text_area).w,this->mCursorOldY,3,this->mMaxsize,H);
        fl_pop_clip();
      }
    }
    else {
      pFVar8 = Fl_Surface_Device::surface();
      pFVar9 = &Fl_Display_Device::display_device()->super_Fl_Surface_Device;
      if (pFVar8 != pFVar9) {
        fl_rectf((this->text_area).x,(this->text_area).y,(this->text_area).w,(this->text_area).h,H);
      }
      X = Fl_Widget::w((Fl_Widget *)this);
      Y = Fl_Widget::h((Fl_Widget *)this);
      t = Fl_Widget::box((Fl_Widget *)this);
      iVar2 = Fl_Widget::x((Fl_Widget *)this);
      iVar3 = Fl_Widget::y((Fl_Widget *)this);
      Fl_Widget::draw_box((Fl_Widget *)this,t,iVar2,iVar3,X,Y,H);
      uVar6 = Fl_Widget::visible((Fl_Widget *)this->mHScrollBar);
      if (uVar6 != 0) {
        iVar2 = scrollbar_width(this);
        X = X - iVar2;
      }
      uVar6 = Fl_Widget::visible((Fl_Widget *)this->mVScrollBar);
      if (uVar6 != 0) {
        iVar2 = scrollbar_width(this);
        Y = Y - iVar2;
      }
      fl_rectf((this->text_area).x + -3,(this->text_area).y + -1,3,(this->text_area).h + 2,H);
      fl_rectf((this->text_area).x + (this->text_area).w,(this->text_area).y + -1,3,
               (this->text_area).h + 2,H);
      fl_rectf((this->text_area).x,(this->text_area).y + -1,(this->text_area).w,1,H);
      fl_rectf((this->text_area).x,(this->text_area).y + (this->text_area).h,(this->text_area).w,1,H
              );
      uVar6 = Fl_Widget::visible((Fl_Widget *)this->mVScrollBar);
      if ((uVar6 != 0) && (uVar6 = Fl_Widget::visible((Fl_Widget *)this->mHScrollBar), uVar6 != 0))
      {
        iVar2 = Fl_Widget::x((Fl_Widget *)this->mVScrollBar);
        iVar3 = Fl_Widget::y((Fl_Widget *)this->mHScrollBar);
        iVar4 = Fl_Widget::w((Fl_Widget *)this->mVScrollBar);
        iVar5 = Fl_Widget::h((Fl_Widget *)this->mHScrollBar);
        fl_rectf(iVar2,iVar3,iVar4,iVar5,0x31);
      }
    }
    bVar1 = Fl_Widget::damage((Fl_Widget *)this);
    if ((bVar1 & 0x81) != 0) {
      Fl_Widget::damage((Fl_Widget *)this->mVScrollBar,0x80);
      Fl_Widget::damage((Fl_Widget *)this->mHScrollBar,0x80);
    }
    Fl_Group::update_child(&this->super_Fl_Group,(Fl_Widget *)this->mVScrollBar);
    Fl_Group::update_child(&this->super_Fl_Group,(Fl_Widget *)this->mHScrollBar);
    bVar1 = Fl_Widget::damage((Fl_Widget *)this);
    if ((bVar1 & 0x82) == 0) {
      bVar1 = Fl_Widget::damage((Fl_Widget *)this);
      if ((bVar1 & 4) != 0) {
        fl_push_clip((this->text_area).x,(this->text_area).y,(this->text_area).w,(this->text_area).h
                    );
        draw_range(this,this->damage_range1_start,this->damage_range1_end);
        if (this->damage_range2_end != -1) {
          draw_range(this,this->damage_range2_start,this->damage_range2_end);
        }
        this->damage_range1_end = -1;
        this->damage_range1_start = -1;
        this->damage_range2_end = -1;
        this->damage_range2_start = -1;
        fl_pop_clip();
      }
    }
    else {
      iVar2 = fl_clip_box((this->text_area).x,(this->text_area).y,(this->text_area).w,
                          (this->text_area).h,&W_1,&H_1,&start,&end);
      if (iVar2 == 0) {
        draw_text(this,(this->text_area).x,(this->text_area).y,(this->text_area).w,
                  (this->text_area).h);
      }
      else {
        draw_text(this,W_1,H_1,start,end);
      }
    }
    pFVar7 = buffer(this);
    Y_1 = Fl_Text_Buffer::selection_position(pFVar7,&has_selection,&X_1);
    bVar1 = Fl_Widget::damage((Fl_Widget *)this);
    if ((((bVar1 & 0x86) != 0) &&
        (((Y_1 == 0 || (this->mCursorPos < has_selection)) || (X_1 < this->mCursorPos)))) &&
       ((this->mCursorOn != 0 && (pFVar10 = (Fl_Text_Display *)Fl::focus(), pFVar10 == this)))) {
      fl_push_clip((this->text_area).x + -3,(this->text_area).y,(this->text_area).w + 6,
                   (this->text_area).h);
      local_3c = 0;
      local_40 = 0;
      iVar2 = position_to_xy(this,this->mCursorPos,&local_3c,&local_40);
      if (iVar2 != 0) {
        draw_cursor(this,local_3c,local_40);
        this->mCursorOldY = local_40;
      }
      fl_pop_clip();
    }
    draw_line_numbers(this,true);
    fl_pop_clip();
  }
  return;
}

Assistant:

void Fl_Text_Display::draw(void) {
  // don't even try if there is no associated text buffer!
  if (!buffer()) { draw_box(); return; }

  fl_push_clip(x(),y(),w(),h());	// prevent drawing outside widget area

  // background color -- change if inactive
  Fl_Color bgcolor = active_r() ? color() : fl_inactive(color());

  // draw the non-text, non-scrollbar areas.
  if (damage() & FL_DAMAGE_ALL) {
    //    printf("drawing all (box = %d)\n", box());
    if (Fl_Surface_Device::surface() != Fl_Display_Device::display_device()) {
      // if to printer, draw the background
      fl_rectf(text_area.x, text_area.y, text_area.w, text_area.h, bgcolor);
    }
    // draw the box()
    int W = w(), H = h();
    draw_box(box(), x(), y(), W, H, bgcolor);

    if (mHScrollBar->visible())
      W -= scrollbar_width();
    if (mVScrollBar->visible())
      H -= scrollbar_width();

    // left margin
    fl_rectf(text_area.x-LEFT_MARGIN, text_area.y-TOP_MARGIN,
             LEFT_MARGIN, text_area.h+TOP_MARGIN+BOTTOM_MARGIN,
             bgcolor);

    // right margin
    fl_rectf(text_area.x+text_area.w, text_area.y-TOP_MARGIN,
             RIGHT_MARGIN, text_area.h+TOP_MARGIN+BOTTOM_MARGIN,
             bgcolor);

    // top margin
    fl_rectf(text_area.x, text_area.y-TOP_MARGIN,
             text_area.w, TOP_MARGIN, bgcolor);

    // bottom margin
    fl_rectf(text_area.x, text_area.y+text_area.h,
             text_area.w, BOTTOM_MARGIN, bgcolor);

    // draw that little box in the corner of the scrollbars
    if (mVScrollBar->visible() && mHScrollBar->visible())
      fl_rectf(mVScrollBar->x(), mHScrollBar->y(),
               mVScrollBar->w(), mHScrollBar->h(),
               FL_GRAY);
    //draw_line_numbers(true);		// commented out STR# 2621 / LZA
  }
  else if (damage() & (FL_DAMAGE_SCROLL | FL_DAMAGE_EXPOSE)) {
    //    printf("blanking previous cursor extrusions at Y: %d\n", mCursorOldY);
    // CET - FIXME - save old cursor position instead and just draw side needed?
    fl_push_clip(text_area.x-LEFT_MARGIN,
                 text_area.y,
                 text_area.w+LEFT_MARGIN+RIGHT_MARGIN,
                 text_area.h);
    fl_rectf(text_area.x-LEFT_MARGIN, mCursorOldY,
             LEFT_MARGIN, mMaxsize, bgcolor);
    fl_rectf(text_area.x+text_area.w, mCursorOldY,
             RIGHT_MARGIN, mMaxsize, bgcolor);
    fl_pop_clip();
  }

  // draw the scrollbars
  if (damage() & (FL_DAMAGE_ALL | FL_DAMAGE_CHILD)) {
    mVScrollBar->damage(FL_DAMAGE_ALL);
    mHScrollBar->damage(FL_DAMAGE_ALL);
  }
  update_child(*mVScrollBar);
  update_child(*mHScrollBar);

  // draw all of the text
  if (damage() & (FL_DAMAGE_ALL | FL_DAMAGE_EXPOSE)) {
    //printf("drawing all text\n");
    int X, Y, W, H;
    if (fl_clip_box(text_area.x, text_area.y, text_area.w, text_area.h,
                    X, Y, W, H)) {
      // Draw text using the intersected clipping box...
      // (this sets the clipping internally)
      draw_text(X, Y, W, H);
    } else {
      // Draw the whole area...
      draw_text(text_area.x, text_area.y, text_area.w, text_area.h);
    }
  }
  else if (damage() & FL_DAMAGE_SCROLL) {
    // draw some lines of text
    fl_push_clip(text_area.x, text_area.y,
                 text_area.w, text_area.h);
    //printf("drawing text from %d to %d\n", damage_range1_start, damage_range1_end);
    draw_range(damage_range1_start, damage_range1_end);
    if (damage_range2_end != -1) {
      //printf("drawing text from %d to %d\n", damage_range2_start, damage_range2_end);
      draw_range(damage_range2_start, damage_range2_end);
    }
    damage_range1_start = damage_range1_end = -1;
    damage_range2_start = damage_range2_end = -1;
    fl_pop_clip();
  }

  // draw the text cursor
  int start, end;
  int has_selection = buffer()->selection_position(&start, &end);
  if (damage() & (FL_DAMAGE_ALL | FL_DAMAGE_SCROLL | FL_DAMAGE_EXPOSE)
      && (
#ifdef __APPLE__
	  Fl::compose_state ||
#endif
	  !has_selection || mCursorPos < start || mCursorPos > end) &&
      mCursorOn && Fl::focus() == (Fl_Widget*)this ) {
    fl_push_clip(text_area.x-LEFT_MARGIN,
                 text_area.y,
                 text_area.w+LEFT_MARGIN+RIGHT_MARGIN,
                 text_area.h);

    int X = 0, Y = 0;
    if (position_to_xy(mCursorPos, &X, &Y)) {
      draw_cursor(X, Y);
      mCursorOldY = Y;
    }
    //    else puts("position_to_xy() failed - unable to draw cursor!");
    //printf("drew cursor at pos: %d (%d,%d)\n", mCursorPos, X, Y);
    fl_pop_clip();
  }

  // Important to do this at end of this method, otherwise line numbers
  // will not scroll with the text edit area
  draw_line_numbers(true);
    
  fl_pop_clip();
}